

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O3

int __thiscall cashew::JSPrinter::getPrecedence(JSPrinter *this,Ref node,bool parent)

{
  int *piVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  undefined8 *puVar5;
  char *pcVar6;
  Type TVar8;
  IString IVar9;
  IString IVar10;
  Value *local_20;
  Ref node_local;
  Ref type;
  size_t sVar7;
  
  local_20 = node.inst;
  if ((node.inst)->type - Assign_ < 2) {
    IVar9.str._M_str = ::wasm::BLOCK;
    IVar9.str._M_len = SET;
    iVar4 = cashew::OperatorClass::getPrecedence(Binary,IVar9);
    return iVar4;
  }
  if ((node.inst)->type != Array) {
    return -1;
  }
  puVar5 = (undefined8 *)cashew::Ref::operator[]((uint)&local_20);
  node_local.inst = (Value *)*puVar5;
  cVar2 = cashew::Ref::operator==(&node_local,(IString *)&BINARY);
  if ((cVar2 == '\0') &&
     (cVar2 = cashew::Ref::operator==(&node_local,(IString *)&UNARY_PREFIX), cVar2 == '\0')) {
    cVar2 = cashew::Ref::operator==(&node_local,(IString *)&SEQ);
    if (cVar2 == '\0') {
      cVar2 = cashew::Ref::operator==(&node_local,(IString *)&CALL);
      if (cVar2 == '\0') {
        cVar2 = cashew::Ref::operator==(&node_local,(IString *)&CONDITIONAL);
        if (cVar2 == '\0') {
          return -1;
        }
        TVar8 = Tertiary;
        pcVar6 = UNARY_PREFIX;
        sVar7 = QUESTION;
        goto LAB_00178613;
      }
      if (!parent) {
        return -1;
      }
    }
    TVar8 = Binary;
    pcVar6 = _isCallWithoutEffects;
    sVar7 = COMMA;
  }
  else {
    bVar3 = cashew::Ref::operator==(&node_local,(IString *)&BINARY);
    puVar5 = (undefined8 *)cashew::Ref::operator[]((uint)&local_20);
    piVar1 = (int *)*puVar5;
    if (*piVar1 != 0) {
      __assert_fail("isString()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                    ,0xef,"IString &cashew::Value::getIString()");
    }
    TVar8 = (Type)(bVar3 ^ 1);
    pcVar6 = *(char **)(piVar1 + 4);
    sVar7 = *(size_t *)(piVar1 + 2);
  }
LAB_00178613:
  IVar10.str._M_str = pcVar6;
  IVar10.str._M_len = sVar7;
  iVar4 = cashew::OperatorClass::getPrecedence(TVar8,IVar10);
  return iVar4;
}

Assistant:

int getPrecedence(Ref node, bool parent) {
    if (node->isAssign() || node->isAssignName()) {
      return OperatorClass::getPrecedence(OperatorClass::Binary, SET);
    }
    if (!node->isArray()) {
      // node is a value
      return -1;
    }
    Ref type = node[0];
    if (type == BINARY || type == UNARY_PREFIX) {
      return OperatorClass::getPrecedence(
        type == BINARY ? OperatorClass::Binary : OperatorClass::Prefix,
        node[1]->getIString());
    } else if (type == SEQ) {
      return OperatorClass::getPrecedence(OperatorClass::Binary, COMMA);
    } else if (type == CALL) {
      // call arguments are split by commas, but call itself is safe
      return parent ? OperatorClass::getPrecedence(OperatorClass::Binary, COMMA)
                    : -1;
    } else if (type == CONDITIONAL) {
      return OperatorClass::getPrecedence(OperatorClass::Tertiary, QUESTION);
    }
    // otherwise, this is something that fixes precedence explicitly, and we can
    // ignore
    return -1; // XXX
  }